

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.h
# Opt level: O1

void __thiscall
UnifiedRegex::CharSet<char16_t>::RemoveCompactChar(CharSet<char16_t> *this,uint index)

{
  size_t sVar1;
  code *pcVar2;
  bool bVar3;
  uint value;
  undefined4 *puVar4;
  
  if (4 < (this->rep).compact.countPlusOne - 1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                       ,0x1ef,"(IsCompact())","IsCompact()");
    if (!bVar3) goto LAB_00e730c9;
    *puVar4 = 0;
  }
  if (*(int *)&this->rep - 1U <= index) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                       ,0x22a,"(index < this->GetCompactLength())",
                       "index < this->GetCompactLength()");
    if (!bVar3) goto LAB_00e730c9;
    *puVar4 = 0;
  }
  if (4 < (this->rep).compact.countPlusOne - 1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                       ,0x22b,"(IsCompact())","IsCompact()");
    if (!bVar3) goto LAB_00e730c9;
    *puVar4 = 0;
  }
  if (4 < (this->rep).compact.countPlusOne - 1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                       ,0x1ef,"(IsCompact())","IsCompact()");
    if (!bVar3) goto LAB_00e730c9;
    *puVar4 = 0;
  }
  sVar1 = (this->rep).compact.countPlusOne;
  if ((int)sVar1 - 2U == index) {
    ClearCompactChar(this,index);
  }
  else {
    if (4 < sVar1 - 1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                         ,0x1ef,"(IsCompact())","IsCompact()");
      if (!bVar3) {
LAB_00e730c9:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar4 = 0;
    }
    value = GetCompactCharU(this,*(int *)&this->rep - 2);
    ReplaceCompactCharU(this,index,value);
  }
  (this->rep).full.root = (CharSetNode *)((this->rep).compact.countPlusOne - 1);
  return;
}

Assistant:

inline void RemoveCompactChar(uint index)
        {
            Assert(index < this->GetCompactLength());
            Assert(IsCompact());

            if (index == this->GetCompactLength() - 1)
            {
                this->ClearCompactChar(index);
            }
            else
            {
                this->ReplaceCompactCharU(index, this->GetCompactCharU((uint)this->GetCompactLength() - 1));
            }

            rep.compact.countPlusOne -= 1;
        }